

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O0

void __thiscall ON_MeshModifiers::CImpl::LoadFromXML(CImpl *this,ON_XMLRootNode *root)

{
  bool bVar1;
  int iVar2;
  ON_XMLNode *dsp_node;
  undefined4 extraout_var;
  ON_Displacement *this_00;
  ON_EdgeSoftening *this_01;
  ON_Thickening *this_02;
  ON_CurvePiping *this_03;
  ON_ShutLining *this_04;
  ON_wString *s;
  ON_XMLNode *child_node;
  ChildIterator it;
  ON_XMLRootNode *root_local;
  CImpl *this_local;
  ON_wString *rhs;
  
  it._private = (ON_XMLNodeChildIteratorPrivate *)root;
  (*(root->super_ON_XMLNode)._vptr_ON_XMLNode[0x2c])(&child_node);
  while (dsp_node = ON_XMLNode::ChildIterator::GetNextChild((ChildIterator *)&child_node),
        dsp_node != (ON_XMLNode *)0x0) {
    iVar2 = (*dsp_node->_vptr_ON_XMLNode[3])();
    rhs = (ON_wString *)CONCAT44(extraout_var,iVar2);
    bVar1 = ::operator==(L"new-displacement-object-data",rhs);
    if (bVar1) {
      this_00 = (ON_Displacement *)operator_new(0x18);
      ON_Displacement::ON_Displacement(this_00,dsp_node);
      this->m_displacement = this_00;
    }
    else {
      bVar1 = ::operator==(L"edge-softening-object-data",rhs);
      if (bVar1) {
        this_01 = (ON_EdgeSoftening *)operator_new(0x10);
        ON_EdgeSoftening::ON_EdgeSoftening(this_01,dsp_node);
        this->m_edge_softening = this_01;
      }
      else {
        bVar1 = ::operator==(L"thickening-object-data",rhs);
        if (bVar1) {
          this_02 = (ON_Thickening *)operator_new(0x10);
          ON_Thickening::ON_Thickening(this_02,dsp_node);
          this->m_thickening = this_02;
        }
        else {
          bVar1 = ::operator==(L"curve-piping-object-data",rhs);
          if (bVar1) {
            this_03 = (ON_CurvePiping *)operator_new(0x10);
            ON_CurvePiping::ON_CurvePiping(this_03,dsp_node);
            this->m_curve_piping = this_03;
          }
          else {
            bVar1 = ::operator==(L"shut-lining-object-data",rhs);
            if (bVar1) {
              this_04 = (ON_ShutLining *)operator_new(0x18);
              ON_ShutLining::ON_ShutLining(this_04,dsp_node);
              this->m_shut_lining = this_04;
            }
          }
        }
      }
    }
  }
  ON_XMLNode::ChildIterator::~ChildIterator((ChildIterator *)&child_node);
  return;
}

Assistant:

void ON_MeshModifiers::CImpl::LoadFromXML(const ON_XMLRootNode& root)
{
  auto it = root.GetChildIterator();
  while (ON_XMLNode* child_node = it.GetNextChild())
  {
    const ON_wString& s = child_node->TagName();

    if (ON_DISPLACEMENT_ROOT == s)
    {
      m_displacement = new ON_Displacement(*child_node);
    }
    else
    if (ON_EDGE_SOFTENING_ROOT == s)
    {
      m_edge_softening = new ON_EdgeSoftening(*child_node);
    }
    else
    if (ON_THICKENING_ROOT == s)
    {
      m_thickening = new ON_Thickening(*child_node);
    }
    else
    if (ON_CURVE_PIPING_ROOT == s)
    {
      m_curve_piping = new ON_CurvePiping(*child_node);
    }
    else
    if (ON_SHUTLINING_ROOT == s)
    {
      m_shut_lining = new ON_ShutLining(*child_node);
    }
  }
}